

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O2

global_lu_map_t * __thiscall
tchecker::clockbounds::global_lu_map_t::operator=(global_lu_map_t *this,global_lu_map_t *m)

{
  map_t *pmVar1;
  
  if (this != m) {
    clear(this);
    this->_clock_nb = m->_clock_nb;
    pmVar1 = clone_map(m->_L);
    this->_L = pmVar1;
    pmVar1 = clone_map(m->_U);
    this->_U = pmVar1;
  }
  return this;
}

Assistant:

tchecker::clockbounds::global_lu_map_t & global_lu_map_t::operator=(tchecker::clockbounds::global_lu_map_t const & m)
{
  if (this != &m) {
    clear();

    _clock_nb = m._clock_nb;
    _L = tchecker::clockbounds::clone_map(*m._L);
    _U = tchecker::clockbounds::clone_map(*m._U);
  }
  return *this;
}